

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_pstream.c
# Opt level: O3

void HTS_PStreamSet_clear(HTS_PStreamSet *pss)

{
  double *pdVar1;
  double **ppdVar2;
  HTS_PStream *pHVar3;
  ulong uVar4;
  ulong uVar5;
  
  pHVar3 = pss->pstream;
  if (pHVar3 != (HTS_PStream *)0x0) {
    if (pss->nstream != 0) {
      uVar5 = 0;
      do {
        pHVar3 = pss->pstream;
        pdVar1 = pHVar3[uVar5].sm.wum;
        if (pdVar1 != (double *)0x0) {
          HTS_free(pdVar1);
        }
        pdVar1 = pHVar3[uVar5].sm.g;
        if (pdVar1 != (double *)0x0) {
          HTS_free(pdVar1);
        }
        ppdVar2 = pHVar3[uVar5].sm.wuw;
        if (ppdVar2 != (double **)0x0) {
          HTS_free_matrix(ppdVar2,pHVar3[uVar5].length);
        }
        ppdVar2 = pHVar3[uVar5].sm.ivar;
        if (ppdVar2 != (double **)0x0) {
          HTS_free_matrix(ppdVar2,pHVar3[uVar5].length);
        }
        ppdVar2 = pHVar3[uVar5].sm.mean;
        if (ppdVar2 != (double **)0x0) {
          HTS_free_matrix(ppdVar2,pHVar3[uVar5].length);
        }
        if (pHVar3[uVar5].par != (double **)0x0) {
          HTS_free_matrix(pHVar3[uVar5].par,pHVar3[uVar5].length);
        }
        if (pHVar3[uVar5].msd_flag != (HTS_Boolean *)0x0) {
          HTS_free(pHVar3[uVar5].msd_flag);
        }
        if ((pHVar3[uVar5].win_coefficient != (double **)0x0) && (pHVar3[uVar5].win_size != 0)) {
          uVar4 = 0;
          do {
            pHVar3[uVar5].win_coefficient[uVar4] =
                 pHVar3[uVar5].win_coefficient[uVar4] + pHVar3[uVar5].win_l_width[uVar4];
            HTS_free(pHVar3[uVar5].win_coefficient[uVar4]);
            uVar4 = uVar4 + 1;
          } while (uVar4 < pHVar3[uVar5].win_size);
        }
        if (pHVar3[uVar5].gv_mean != (double *)0x0) {
          HTS_free(pHVar3[uVar5].gv_mean);
        }
        if (pHVar3[uVar5].gv_vari != (double *)0x0) {
          HTS_free(pHVar3[uVar5].gv_vari);
        }
        if (pHVar3[uVar5].win_coefficient != (double **)0x0) {
          HTS_free(pHVar3[uVar5].win_coefficient);
        }
        if (pHVar3[uVar5].win_l_width != (int *)0x0) {
          HTS_free(pHVar3[uVar5].win_l_width);
        }
        if (pHVar3[uVar5].win_r_width != (int *)0x0) {
          HTS_free(pHVar3[uVar5].win_r_width);
        }
        if (pHVar3[uVar5].gv_switch != (HTS_Boolean *)0x0) {
          HTS_free(pHVar3[uVar5].gv_switch);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < pss->nstream);
      pHVar3 = pss->pstream;
    }
    HTS_free(pHVar3);
  }
  pss->pstream = (HTS_PStream *)0x0;
  pss->nstream = 0;
  pss->total_frame = 0;
  return;
}

Assistant:

void HTS_PStreamSet_clear(HTS_PStreamSet * pss)
{
   size_t i, j;
   HTS_PStream *pstream;

   if (pss->pstream) {
      for (i = 0; i < pss->nstream; i++) {
         pstream = &pss->pstream[i];
         if (pstream->sm.wum)
            HTS_free(pstream->sm.wum);
         if (pstream->sm.g)
            HTS_free(pstream->sm.g);
         if (pstream->sm.wuw)
            HTS_free_matrix(pstream->sm.wuw, pstream->length);
         if (pstream->sm.ivar)
            HTS_free_matrix(pstream->sm.ivar, pstream->length);
         if (pstream->sm.mean)
            HTS_free_matrix(pstream->sm.mean, pstream->length);
         if (pstream->par)
            HTS_free_matrix(pstream->par, pstream->length);
         if (pstream->msd_flag)
            HTS_free(pstream->msd_flag);
         if (pstream->win_coefficient) {
            for (j = 0; j < pstream->win_size; j++) {
               pstream->win_coefficient[j] += pstream->win_l_width[j];
               HTS_free(pstream->win_coefficient[j]);
            }
         }
         if (pstream->gv_mean)
            HTS_free(pstream->gv_mean);
         if (pstream->gv_vari)
            HTS_free(pstream->gv_vari);
         if (pstream->win_coefficient)
            HTS_free(pstream->win_coefficient);
         if (pstream->win_l_width)
            HTS_free(pstream->win_l_width);
         if (pstream->win_r_width)
            HTS_free(pstream->win_r_width);
         if (pstream->gv_switch)
            HTS_free(pstream->gv_switch);
      }
      HTS_free(pss->pstream);
   }
   HTS_PStreamSet_initialize(pss);
}